

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O0

void Aig_ObjDeletePo(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  uint uVar2;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsCo(pObj);
  if (iVar1 != 0) {
    pObj_00 = Aig_ObjFanin0(pObj);
    Aig_ObjDeref(pObj_00);
    pObj->pFanin0 = (Aig_Obj_t *)0x0;
    uVar2 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
    p->nObjs[uVar2] = p->nObjs[uVar2] + -1;
    Vec_PtrWriteEntry(p->vObjs,pObj->Id,(void *)0x0);
    Aig_ManRecycleMemory(p,pObj);
    return;
  }
  __assert_fail("Aig_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                ,0x107,"void Aig_ObjDeletePo(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjDeletePo( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    assert( Aig_ObjIsCo(pObj) );
    Aig_ObjDeref(Aig_ObjFanin0(pObj));
    pObj->pFanin0 = NULL;
    p->nObjs[pObj->Type]--;
    Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
    Aig_ManRecycleMemory( p, pObj );
}